

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O1

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint16 value)

{
  uint uVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  long lVar4;
  uint uVar5;
  deUint8 data [2];
  
  data[0] = (deUint8)(value ^ 0x91cb);
  data[1] = SUB21(value ^ 0x91cb,1);
  uVar2 = builder->m_hash;
  lVar3 = 0;
  do {
    uVar2 = uVar2 ^ data[lVar3];
    lVar4 = 8;
    do {
      uVar5 = uVar2 >> 1;
      uVar1 = uVar2 & 1;
      uVar2 = uVar5 ^ 0x4c11db7;
      if (uVar1 == 0) {
        uVar2 = uVar5;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  builder->m_hash = uVar2;
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint16 value)
{
	const deUint16	val		= value ^ 37323u;
	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)(val >> 8),
	};

	builder.feed(sizeof(data), data);
	return builder;
}